

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shuffle.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  long lVar2;
  SecRandom RNG;
  uint8_t S [7];
  SecRandom local_24;
  uchar local_20 [8];
  
  local_20[4] = '\x04';
  local_20[5] = '\x05';
  local_20[6] = '\x06';
  local_20[0] = '\0';
  local_20[1] = '\x01';
  local_20[2] = '\x02';
  local_20[3] = '\x03';
  SecRandom::SecRandom(&local_24);
  std::shuffle<unsigned_char*,SecRandom&>(local_20,local_20 + 7,&local_24);
  for (lVar2 = 0; lVar2 != 7; lVar2 = lVar2 + 1) {
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::operator<<(poVar1,",");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  SecRandom::~SecRandom(&local_24);
  return 0;
}

Assistant:

int main()
{
  uint8_t S[] = {0,1,2,3,4,5,6};
  SecRandom RNG;
  std::shuffle(std::begin(S), std::end(S), RNG);
  for (uint8_t C: S) {
    std::cout << (unsigned int) C << ",";
  }
  std::cout << std::endl;
  return 0;
}